

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

void aspa_update_callback
               (aspa_table *s,aspa_record record,rtr_socket *rtr_sockt,
               aspa_operation_type operation_type)

{
  long lVar1;
  long in_FS_OFFSET;
  size_t count;
  size_t i;
  ulong uStack_30;
  char c;
  size_t k;
  aspa_operation_type operation_type_local;
  rtr_socket *rtr_sockt_local;
  aspa_table *s_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (assert_callbacks) {
    if (callback_count == 0) {
      __assert_fail("callback_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xd0,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    if (callback_count <= callback_index) {
      __assert_fail("callback_index < callback_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xd1,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    if (expected_callbacks == (update_callback *)0x0) {
      __assert_fail("expected_callbacks",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xd2,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    if (expected_callbacks[callback_index].source != (aspa_table *)0x0) {
      if (expected_callbacks[callback_index].source != s) {
        printf("Assertion failed: Callback originates from unexpected table.\n");
      }
      if (expected_callbacks[callback_index].source != s) {
        __assert_fail("expected_callbacks[callback_index].source == s",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0xd8,
                      "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                     );
      }
    }
    if (expected_callbacks[callback_index].record.customer_asn != record.customer_asn) {
      __assert_fail("expected_callbacks[callback_index].record.customer_asn == record.customer_asn",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xdb,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    if (expected_callbacks[callback_index].type != operation_type) {
      __assert_fail("expected_callbacks[callback_index].type == operation_type",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xdc,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    if (expected_callbacks[callback_index].record.provider_count != record.provider_count) {
      __assert_fail("expected_callbacks[callback_index].record.provider_count == record.provider_count"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                    ,0xdd,
                    "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                   );
    }
    for (uStack_30 = 0; uStack_30 < record.provider_count; uStack_30 = uStack_30 + 1) {
      if (expected_callbacks[callback_index].record.provider_asns[uStack_30] !=
          record.provider_asns[uStack_30]) {
        __assert_fail("expected_callbacks[callback_index].record.provider_asns[k] == record.provider_asns[k]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                      ,0xe0,
                      "void aspa_update_callback(struct aspa_table *, const struct aspa_record, const struct rtr_socket *, const enum aspa_operation_type)"
                     );
      }
    }
    callback_index = callback_index + 1;
  }
  if (operation_type == ASPA_REMOVE) {
    i._7_1_ = '-';
  }
  else if (operation_type == ASPA_ADD) {
    i._7_1_ = '+';
  }
  else {
    i._7_1_ = '?';
  }
  printf("%c ASPA ",(ulong)(uint)(int)i._7_1_);
  printf("%u => [ ",(ulong)record.customer_asn);
  for (count = 0; count < record.provider_count; count = count + 1) {
    printf("%u",(ulong)record.provider_asns[count]);
    if (count < record.provider_count - 1) {
      printf(", ");
    }
  }
  printf(" ]\n");
  lrtr_free(record.provider_asns);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void aspa_update_callback(struct aspa_table *s, const struct aspa_record record,
				 const struct rtr_socket *rtr_sockt __attribute__((unused)),
				 const enum aspa_operation_type operation_type)
{
	if (assert_callbacks) {
		assert(callback_count > 0);
		assert(callback_index < callback_count);
		assert(expected_callbacks);

		if (expected_callbacks[callback_index].source) {
			if (expected_callbacks[callback_index].source != s)
				printf("Assertion failed: Callback originates from unexpected table.\n");

			assert(expected_callbacks[callback_index].source == s);
		}

		assert(expected_callbacks[callback_index].record.customer_asn == record.customer_asn);
		assert(expected_callbacks[callback_index].type == operation_type);
		assert(expected_callbacks[callback_index].record.provider_count == record.provider_count);

		for (size_t k = 0; k < record.provider_count; k++)
			assert(expected_callbacks[callback_index].record.provider_asns[k] == record.provider_asns[k]);

		callback_index += 1;
	}

	char c;

	switch (operation_type) {
	case ASPA_ADD:
		c = '+';
		break;
	case ASPA_REMOVE:
		c = '-';
		break;
	default:
		c = '?';
		break;
	}

	printf("%c ASPA ", c);
	printf("%u => [ ", record.customer_asn);

	size_t i;
	size_t count = record.provider_count;

	for (i = 0; i < count; i++) {
		printf("%u", record.provider_asns[i]);
		if (i < count - 1)
			printf(", ");
	}

	printf(" ]\n");
	lrtr_free(record.provider_asns);
}